

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.cc
# Opt level: O0

void __thiscall Graph::trim(Graph *this)

{
  ulong uVar1;
  bool bVar2;
  vector<Graph::GNode,_std::allocator<Graph::GNode>_> *pvVar3;
  size_type sVar4;
  reference pvVar5;
  vector<Graph::GEdge,_std::allocator<Graph::GEdge>_> *this_00;
  reference pvVar6;
  ulong local_90;
  unsigned_long j;
  __normal_iterator<Graph::GNode_*,_std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>_>
  local_80;
  __normal_iterator<Graph::GNode_*,_std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>_>
  local_78;
  const_iterator local_70;
  ulong local_68;
  unsigned_long i_1;
  __normal_iterator<Graph::GEdge_*,_std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>_>
  local_58;
  __normal_iterator<Graph::GEdge_*,_std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>_>
  local_50;
  const_iterator local_48;
  ulong local_40;
  unsigned_long x;
  GNode *node;
  iterator __end2;
  iterator __begin2;
  vector<Graph::GNode,_std::allocator<Graph::GNode>_> *__range2;
  unsigned_long i;
  Graph *this_local;
  
  for (__range2 = (vector<Graph::GNode,_std::allocator<Graph::GNode>_> *)0x0;
      pvVar3 = (vector<Graph::GNode,_std::allocator<Graph::GNode>_> *)
               std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::size(&this->nodes),
      __range2 < pvVar3;
      __range2 = (vector<Graph::GNode,_std::allocator<Graph::GNode>_> *)
                 ((long)&(__range2->super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 1)) {
    __end2 = std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::begin(&this->nodes);
    node = (GNode *)std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::end(&this->nodes);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Graph::GNode_*,_std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>_>
                                       *)&node), bVar2) {
      x = (unsigned_long)
          __gnu_cxx::
          __normal_iterator<Graph::GNode_*,_std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>_>
          ::operator*(&__end2);
      for (local_40 = 0; uVar1 = local_40,
          sVar4 = std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::size
                            ((vector<Graph::GEdge,_std::allocator<Graph::GEdge>_> *)(x + 0x20)),
          uVar1 < sVar4; local_40 = local_40 + 1) {
        pvVar5 = std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::at
                           ((vector<Graph::GEdge,_std::allocator<Graph::GEdge>_> *)(x + 0x20),
                            local_40);
        sVar4 = std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::size(&pvVar5->node->edges)
        ;
        if (sVar4 < 2) {
          this_00 = (vector<Graph::GEdge,_std::allocator<Graph::GEdge>_> *)(x + 0x20);
          local_58._M_current =
               (GEdge *)std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::begin
                                  ((vector<Graph::GEdge,_std::allocator<Graph::GEdge>_> *)(x + 0x20)
                                  );
          local_50 = __gnu_cxx::
                     __normal_iterator<Graph::GEdge_*,_std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>_>
                     ::operator+(&local_58,local_40);
          __gnu_cxx::
          __normal_iterator<Graph::GEdge_const*,std::vector<Graph::GEdge,std::allocator<Graph::GEdge>>>
          ::__normal_iterator<Graph::GEdge*>
                    ((__normal_iterator<Graph::GEdge_const*,std::vector<Graph::GEdge,std::allocator<Graph::GEdge>>>
                      *)&local_48,&local_50);
          i_1 = (unsigned_long)
                std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::erase(this_00,local_48);
        }
      }
      __gnu_cxx::
      __normal_iterator<Graph::GNode_*,_std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>_>::
      operator++(&__end2);
    }
  }
  for (local_68 = 0; uVar1 = local_68,
      sVar4 = std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::size(&this->nodes),
      uVar1 < sVar4; local_68 = local_68 + 1) {
    pvVar6 = std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::at(&this->nodes,local_68);
    sVar4 = std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::size(&pvVar6->edges);
    if (sVar4 < 2) {
      local_80._M_current =
           (GNode *)std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::begin(&this->nodes);
      local_78 = __gnu_cxx::
                 __normal_iterator<Graph::GNode_*,_std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>_>
                 ::operator+(&local_80,local_68);
      __gnu_cxx::
      __normal_iterator<Graph::GNode_const*,std::vector<Graph::GNode,std::allocator<Graph::GNode>>>
      ::__normal_iterator<Graph::GNode*>
                ((__normal_iterator<Graph::GNode_const*,std::vector<Graph::GNode,std::allocator<Graph::GNode>>>
                  *)&local_70,&local_78);
      std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::erase(&this->nodes,local_70);
      if (local_68 < 2) {
        local_68 = 0;
      }
      else {
        local_68 = local_68 - 2;
      }
    }
  }
  for (local_90 = 0;
      sVar4 = std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::size(&this->nodes),
      local_90 < sVar4; local_90 = local_90 + 1) {
    pvVar6 = std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::at(&this->nodes,local_90);
    pvVar6->key = (int)local_90;
  }
  return;
}

Assistant:

void Graph::trim() {
    // remove all bad edges from nodes
    for (unsigned long int i = 0;
         i < nodes.size(); ++i) { // this needs to be done probably fewer times, try and prove this
        for (auto & node : nodes) {
            for (unsigned long int x = 0; x < node.edges.size(); ++x) {
                if (node.edges.at(x).node->edges.size() < 2) {
                    node.edges.erase(node.edges.begin() + x);
                }
            }
        }
    }


    // remove all nodes with only one edge
    for (unsigned long int i = 0; i < nodes.size(); ++i) {
        if (nodes.at(i).edges.size() < 2) {
            nodes.erase(nodes.begin() + i);
            if (i < 2) {
                i = 0;
            } else {
                i -= 2;
            }
        }
    }

    // reset all of the key values
    for (unsigned long int j = 0; j < nodes.size(); ++j) {
        nodes.at(j).key = j;
    }

}